

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::MoveCommand(UCIAdapter *this,char *params)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  Output *this_00;
  bool bVar4;
  Output local_28;
  char *local_20;
  char *move;
  char *params_local;
  UCIAdapter *this_local;
  
  move = params;
  params_local = (char *)this;
  uVar1 = (*this->engine->_vptr_ChessEngine[8])();
  if ((uVar1 & 1) == 0) {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  std::__cxx11::string::clear();
  while( true ) {
    bVar4 = false;
    if (move != (char *)0x0) {
      pcVar3 = NextWord(&move);
      bVar4 = *pcVar3 != '\0';
    }
    if (!bVar4) {
      return;
    }
    local_20 = move;
    bVar4 = IsMove(move);
    if (!bVar4) break;
    iVar2 = (*this->engine->_vptr_ChessEngine[10])(this->engine,move);
    move = (char *)CONCAT44(extraout_var,iVar2);
    if (move == (char *)0x0) break;
    bVar4 = ChessEngine::IsDebugOn(this->engine);
    if (bVar4) {
      (*this->engine->_vptr_ChessEngine[0xc])();
    }
  }
  Output::Output(&local_28,InfoPrefix);
  this_00 = Output::operator<<(&local_28,(char (*) [15])"Invalid move: ");
  Output::operator<<(this_00,&local_20);
  Output::~Output(&local_28);
  return;
}

Assistant:

void UCIAdapter::MoveCommand(const char* params)
{
  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  lastPosition.clear();
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move) || !(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      return;
    }
    if (engine->IsDebugOn()) {
      engine->PrintBoard();
    }
  }
}